

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

void __thiscall
QNetworkHeadersPrivate::parseAndSetHeader
          (QNetworkHeadersPrivate *this,KnownHeaders key,QByteArrayView value)

{
  Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *this_00;
  Node<QNetworkRequest::KnownHeaders,_QVariant> *pNVar1;
  long in_FS_OFFSET;
  KnownHeaders copy;
  KnownHeaders local_50;
  KnownHeaders local_4c;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = key;
  if (value.m_data == (storage_type *)0x0) {
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::removeImpl<QNetworkRequest::KnownHeaders>
              (&this->cookedHeaders,&local_50);
  }
  else {
    if (key == ContentLengthHeader) {
      local_48._0_4_ = 1;
      this_00 = (this->cookedHeaders).d;
      if (this_00 != (Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *)0x0) {
        pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::
                 findNode<QNetworkRequest::KnownHeaders>(this_00,(KnownHeaders *)local_48.data);
        if (pNVar1 != (Node<QNetworkRequest::KnownHeaders,_QVariant> *)0x0) goto LAB_0019e0be;
      }
    }
    parseHeaderValue((QVariant *)&local_48,local_50,value);
    local_4c = local_50;
    QHash<QNetworkRequest::KnownHeaders,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::KnownHeaders,QVariant> *)&this->cookedHeaders,&local_4c,
               (QVariant *)&local_48);
    QVariant::~QVariant((QVariant *)&local_48);
  }
LAB_0019e0be:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkHeadersPrivate::parseAndSetHeader(QNetworkRequest::KnownHeaders key,
                                               QByteArrayView value)
{
    if (value.isNull()) {
        cookedHeaders.remove(key);
    } else if (key == QNetworkRequest::ContentLengthHeader
               && cookedHeaders.contains(QNetworkRequest::ContentLengthHeader)) {
        // Only set the cooked header "Content-Length" once.
        // See bug QTBUG-15311
    } else {
        cookedHeaders.insert(key, parseHeaderValue(key, value));
    }
}